

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Subst_LForward
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *B)

{
  char cVar1;
  complex<double> **ppcVar2;
  complex<double> *pcVar3;
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar6;
  complex<double> *__y;
  complex<double> *pcVar7;
  int iVar8;
  int64_t j;
  long col;
  long row;
  complex<double> *pcVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar10;
  double local_68;
  double dStack_60;
  undefined1 local_40 [16];
  
  lVar6 = (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar5 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar8 = 0;
  if ((lVar6 == CONCAT44(extraout_var,iVar5)) &&
     ((cVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed,
      cVar1 == '\x04' || (cVar1 == '\x01')))) {
    iVar5 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    row = 0;
    lVar6 = CONCAT44(extraout_var_00,iVar5);
    if (CONCAT44(extraout_var_00,iVar5) == 0 || extraout_var_00 < 0) {
      lVar6 = row;
    }
    for (; row != lVar6; row = row + 1) {
      for (col = 0; col < (B->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
          col = col + 1) {
        ppcVar2 = (this->fElem).fStore;
        pcVar7 = ppcVar2[row];
        pcVar3 = ppcVar2[row + 1];
        __y = TPZFMatrix<std::complex<double>_>::operator()(B,row,col);
        local_68 = 0.0;
        dStack_60 = 0.0;
        while( true ) {
          __y = __y + -1;
          pcVar9 = pcVar7 + 1;
          if (pcVar3 <= pcVar9) break;
          local_40._0_8_ = *(undefined8 *)pcVar9->_M_value;
          dVar10 = -*(double *)(pcVar7[1]._M_value + 8);
          local_40._8_8_ = dVar10;
          std::operator*((complex<double> *)local_40,__y);
          local_68 = local_68 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          dStack_60 = dStack_60 + dVar10;
          pcVar7 = pcVar9;
        }
        pcVar7 = TPZFMatrix<std::complex<double>_>::operator()(B,row,col);
        dStack_60 = *(double *)(pcVar7->_M_value + 8) - dStack_60;
        auVar4._8_4_ = SUB84(dStack_60,0);
        auVar4._0_8_ = *(double *)pcVar7->_M_value - local_68;
        auVar4._12_4_ = (int)((ulong)dStack_60 >> 0x20);
        *(undefined1 (*) [16])pcVar7->_M_value = auVar4;
      }
    }
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU) )
        return( 0 );
    
    int64_t dimension =this->Dim();
    for ( int64_t k = 0; k < dimension; k++ ) {
        for ( int64_t j = 0; j < B->Cols(); j++ ) {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar *BPtr = &(*B)(k,j);
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
        }
    }
    return( 1 );
}